

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O2

CURLUcode curl_url_set(CURLU *u,CURLUPart what,char *part,uint flags)

{
  uchar uVar1;
  char cVar2;
  byte bVar3;
  byte bVar4;
  _Bool _Var5;
  int iVar6;
  uint uVar7;
  CURLUcode CVar8;
  CURLU *pCVar9;
  Curl_handler *pCVar10;
  size_t sVar11;
  uchar *hostname;
  long lVar12;
  size_t sVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  long lVar18;
  uchar uVar19;
  bool bVar20;
  char cVar21;
  uint uVar22;
  uint uVar23;
  byte *buffer;
  uchar *puVar24;
  uchar *puVar25;
  char *__s;
  byte bVar26;
  byte *url;
  byte *pbVar27;
  uint uVar28;
  bool bVar29;
  long lStack_80;
  long local_60;
  char *oldurl;
  CURLU *local_38;
  
  if (u == (CURLU *)0x0) {
    return CURLUE_BAD_HANDLE;
  }
  if (part == (char *)0x0) {
    switch(what) {
    case CURLUPART_URL:
      goto switchD_0047c275_caseD_0;
    case CURLUPART_SCHEME:
      break;
    case CURLUPART_USER:
      u = (CURLU *)&u->user;
      break;
    case CURLUPART_PASSWORD:
      u = (CURLU *)&u->password;
      break;
    case CURLUPART_OPTIONS:
      u = (CURLU *)&u->options;
      break;
    case CURLUPART_HOST:
      u = (CURLU *)&u->host;
      break;
    case CURLUPART_PORT:
      u->portnum = 0;
      u = (CURLU *)&u->port;
      break;
    case CURLUPART_PATH:
      u = (CURLU *)&u->path;
      break;
    case CURLUPART_QUERY:
      u = (CURLU *)&u->query;
      break;
    case CURLUPART_FRAGMENT:
      u = (CURLU *)&u->fragment;
      break;
    case CURLUPART_ZONEID:
      u = (CURLU *)&u->zoneid;
      break;
    default:
      return CURLUE_UNKNOWN_PART;
    }
    if (u->scheme == (char *)0x0) {
      return CURLUE_OK;
    }
    (*Curl_cfree)(u->scheme);
    u->scheme = (char *)0x0;
    return CURLUE_OK;
  }
  if (CURLUPART_ZONEID < what) {
    return CURLUE_UNKNOWN_PART;
  }
  bVar26 = (byte)(flags >> 7) & 1;
  switch(what) {
  case CURLUPART_URL:
    _Var5 = Curl_is_absolute_url(part,(char *)0x0,0x29);
    if ((_Var5) || (CVar8 = curl_url_get(u,CURLUPART_URL,&oldurl,flags), CVar8 != CURLUE_OK)) {
      pCVar9 = (CURLU *)(*Curl_ccalloc)(0x60,1);
      if (pCVar9 == (CURLU *)0x0) {
        return CURLUE_OUT_OF_MEMORY;
      }
      CVar8 = parseurl(part,pCVar9,flags);
      goto joined_r0x0047c23f;
    }
    pcVar14 = (*Curl_cstrdup)(oldurl);
    if (pcVar14 == (char *)0x0) {
      pcVar15 = (char *)0x0;
    }
    else {
      pcVar15 = strstr(pcVar14,"//");
      __s = pcVar15 + 2;
      if (pcVar15 == (char *)0x0) {
        __s = pcVar14;
      }
      cVar2 = *part;
      if (cVar2 == '/') {
        if (part[1] != '/') {
          pcVar15 = strchr(__s,0x2f);
          pcVar16 = strchr(__s,0x3f);
          if (pcVar15 == (char *)0x0) {
            if (pcVar16 != (char *)0x0) {
              *pcVar16 = '\0';
            }
          }
          else {
            pcVar17 = pcVar15;
            if (pcVar16 < pcVar15) {
              pcVar17 = pcVar16;
            }
            if (pcVar16 == (char *)0x0) {
              pcVar17 = pcVar15;
            }
            *pcVar17 = '\0';
          }
          goto LAB_0047c8ce;
        }
        *__s = '\0';
        url = (byte *)(part + 2);
        part = find_host_sep((char *)url);
        bVar20 = false;
      }
      else {
        pcVar15 = strchr(__s,0x3f);
        if (pcVar15 != (char *)0x0) {
          *pcVar15 = '\0';
          cVar2 = *part;
        }
        cVar21 = '?';
        if ((cVar2 != '?') && (pcVar15 = strrchr(__s,0x2f), cVar21 = cVar2, pcVar15 != (char *)0x0))
        {
          *pcVar15 = '\0';
          cVar21 = *part;
        }
        pcVar15 = strchr(__s,0x2f);
        __s = pcVar15 + 1;
        if (pcVar15 == (char *)0x0) {
          __s = (char *)0x0;
        }
        if (cVar21 == '.') {
          part = part + (ulong)(part[1] == '/') * 2;
        }
        iVar6 = 0;
        for (; ((*part == 0x2e && (((byte *)part)[1] == 0x2e)) && (((byte *)part)[2] == 0x2f));
            part = (char *)((byte *)part + 3)) {
          iVar6 = iVar6 + -1;
        }
        if (pcVar15 == (char *)0x0) {
          __s = (char *)0x0;
        }
        else {
          for (; iVar6 != 0; iVar6 = iVar6 + 1) {
            pcVar16 = strrchr(__s,0x2f);
            if (pcVar16 == (char *)0x0) {
              *__s = '\0';
              __s = pcVar15 + 1;
              break;
            }
            *pcVar16 = '\0';
          }
        }
LAB_0047c8ce:
        bVar20 = true;
        url = (byte *)part;
      }
      bVar29 = true;
      lVar12 = 0;
      for (pbVar27 = url; *pbVar27 != 0; pbVar27 = pbVar27 + 1) {
        if (pbVar27 < part) {
          lVar12 = lVar12 + 1;
        }
        else {
          uVar28 = (uint)*pbVar27;
          if (uVar28 == 0x20) {
            if (bVar29) {
              lVar12 = lVar12 + 3;
              bVar29 = true;
            }
            else {
              lVar12 = lVar12 + 1;
              bVar29 = false;
            }
          }
          else {
            if (uVar28 == 0x3f) {
              bVar29 = false;
            }
            _Var5 = urlchar_needs_escaping(uVar28);
            lVar18 = lVar12 + 2;
            if (!_Var5) {
              lVar18 = lVar12;
            }
            lVar12 = lVar18 + 1;
          }
        }
      }
      sVar11 = strlen(pcVar14);
      pcVar15 = (char *)(*Curl_cmalloc)(lVar12 + sVar11 + 2);
      if (pcVar15 != (char *)0x0) {
        memcpy(pcVar15,pcVar14,sVar11);
        bVar26 = *url;
        if (bVar26 != 0x2f) {
          if (__s == (char *)0x0) {
            bVar29 = bVar26 == 0x3f;
          }
          else {
            if (bVar26 == 0x3f) goto LAB_0047c9a1;
            bVar29 = *__s == '\0';
          }
          if (!bVar29) {
            pcVar15[sVar11] = '/';
            sVar11 = sVar11 + 1;
          }
        }
LAB_0047c9a1:
        pbVar27 = url;
        if (!bVar20) {
          pbVar27 = (byte *)find_host_sep((char *)url);
        }
        buffer = (byte *)(pcVar15 + sVar11);
        bVar20 = true;
        for (; bVar26 = *url, bVar26 != 0; url = url + 1) {
          if (url < pbVar27) {
            *buffer = bVar26;
LAB_0047ca26:
            buffer = buffer + 1;
          }
          else {
            uVar28 = (uint)bVar26;
            if (uVar28 == 0x20) {
              if (bVar20) {
                buffer[0] = 0x25;
                buffer[1] = 0x32;
                buffer[2] = 0x30;
                buffer = buffer + 3;
                bVar20 = true;
              }
              else {
                *buffer = 0x2b;
                buffer = buffer + 1;
                bVar20 = false;
              }
            }
            else {
              if (uVar28 == 0x3f) {
                bVar20 = false;
              }
              _Var5 = urlchar_needs_escaping(uVar28);
              if (!_Var5) {
                *buffer = *url;
                goto LAB_0047ca26;
              }
              curl_msnprintf((char *)buffer,4,"%%%02x",(ulong)*url);
              buffer = buffer + 3;
            }
          }
        }
        *buffer = 0;
      }
      (*Curl_cfree)(pcVar14);
    }
    (*Curl_cfree)(oldurl);
    if (pcVar15 == (char *)0x0) {
      return CURLUE_OUT_OF_MEMORY;
    }
    pCVar9 = (CURLU *)(*Curl_ccalloc)(0x60,1);
    if (pCVar9 == (CURLU *)0x0) {
      (*Curl_cfree)(pcVar15);
      return CURLUE_OUT_OF_MEMORY;
    }
    CVar8 = parseurl(pcVar15,pCVar9,flags);
    (*Curl_cfree)(pcVar15);
joined_r0x0047c23f:
    if (CVar8 == CURLUE_OK) {
      mv_urlhandle(pCVar9,u);
      return CURLUE_OK;
    }
    curl_url_cleanup(pCVar9);
    return CVar8;
  case CURLUPART_SCHEME:
    sVar11 = strlen(part);
    if (0x28 < sVar11) {
      return CURLUE_MALFORMED_INPUT;
    }
    if (((flags & 8) == 0) && (pCVar10 = Curl_builtin_scheme(part), pCVar10 == (Curl_handler *)0x0))
    {
      return CURLUE_UNSUPPORTED_SCHEME;
    }
    uVar28 = 0;
    bVar3 = 0;
    bVar4 = 0;
    bVar26 = 0;
    local_60 = 0;
    pCVar9 = u;
    goto LAB_0047c378;
  case CURLUPART_USER:
    pCVar9 = (CURLU *)&u->user;
    break;
  case CURLUPART_PASSWORD:
    pCVar9 = (CURLU *)&u->password;
    break;
  case CURLUPART_OPTIONS:
    pCVar9 = (CURLU *)&u->options;
    break;
  case CURLUPART_HOST:
    pCVar9 = (CURLU *)&u->host;
    (*Curl_cfree)(u->zoneid);
    u->zoneid = (char *)0x0;
    break;
  case CURLUPART_PORT:
    local_60 = strtol(part,&oldurl,10);
    if (local_60 - 0x10000U < 0xffffffffffff0001) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    if (*oldurl != '\0') {
      return CURLUE_MALFORMED_INPUT;
    }
    uVar28 = 0;
    bVar3 = 0;
    bVar4 = 0;
    bVar26 = 0;
    pCVar9 = (CURLU *)&u->port;
    goto LAB_0047c378;
  case CURLUPART_PATH:
    pCVar9 = (CURLU *)&u->path;
    bVar3 = 1;
    goto LAB_0047c366;
  case CURLUPART_QUERY:
    uVar28 = flags >> 8;
    pCVar9 = (CURLU *)&u->query;
    bVar3 = 0;
    bVar4 = bVar26;
    goto LAB_0047c36f;
  case CURLUPART_FRAGMENT:
    pCVar9 = (CURLU *)&u->fragment;
    break;
  case CURLUPART_ZONEID:
    pCVar9 = (CURLU *)&u->zoneid;
  }
  bVar3 = 0;
LAB_0047c366:
  uVar28 = 0;
  bVar4 = 0;
LAB_0047c36f:
  local_60 = 0;
LAB_0047c378:
  sVar11 = strlen(part);
  if (8000000 < sVar11) {
    return CURLUE_MALFORMED_INPUT;
  }
  local_38 = pCVar9;
  if (bVar26 == 0) {
    hostname = (uchar *)(*Curl_cstrdup)(part);
    if (hostname == (uchar *)0x0) {
      return CURLUE_OUT_OF_MEMORY;
    }
    lVar12 = 1;
    puVar24 = hostname;
    do {
      lVar18 = lVar12;
      if (*puVar24 == '%') {
        iVar6 = Curl_isxdigit((uint)puVar24[1]);
        if (((iVar6 != 0) && (iVar6 = Curl_isxdigit((uint)puVar24[2]), iVar6 != 0)) &&
           ((iVar6 = Curl_isupper((uint)puVar24[1]), iVar6 != 0 ||
            (iVar6 = Curl_isupper((uint)puVar24[2]), iVar6 != 0)))) {
          iVar6 = tolower((uint)puVar24[1]);
          puVar24[1] = (uchar)iVar6;
          iVar6 = tolower((uint)puVar24[2]);
          puVar24[2] = (uchar)iVar6;
          lVar18 = 3;
        }
      }
      else if (*puVar24 == '\0') goto LAB_0047c582;
      puVar24 = puVar24 + lVar18;
    } while( true );
  }
  hostname = (uchar *)(*Curl_cmalloc)(sVar11 * 3 + 1);
  if (hostname == (uchar *)0x0) {
    return CURLUE_OUT_OF_MEMORY;
  }
  puVar24 = hostname;
  uVar22 = uVar28;
  puVar25 = (uchar *)part;
  if (bVar4 != 0) {
    lVar12 = 0;
    while( true ) {
      uVar1 = part[lVar12];
      uVar19 = '+';
      if ((uVar1 != ' ') && (uVar19 = uVar1, uVar1 == '\0')) break;
      hostname[lVar12] = uVar19;
      lVar12 = lVar12 + 1;
    }
    hostname[lVar12] = '\0';
    part = (*Curl_cstrdup)((char *)hostname);
    puVar25 = (uchar *)part;
    if ((uchar *)part == (uchar *)0x0) goto LAB_0047c6f5;
  }
  for (; *part != '\0'; part = (char *)((uchar *)part + 1)) {
    _Var5 = Curl_isunreserved(*part);
    uVar1 = *part;
    if ((bool)(uVar1 == '/' & bVar3) || _Var5) {
LAB_0047c50b:
      uVar7 = uVar22 & 0xff;
      uVar23 = uVar7;
      if ((uVar22 & 1) != 0) {
        uVar23 = 0;
      }
      uVar22 = uVar23;
      if (uVar1 != '=') {
        uVar22 = uVar7;
      }
      *puVar24 = uVar1;
      lStack_80 = 1;
    }
    else {
      if (uVar1 != '=') {
        if (uVar1 != '+' || bVar4 != 1) goto LAB_0047c544;
        goto LAB_0047c50b;
      }
      if ((uVar22 & 1) != 0) goto LAB_0047c50b;
LAB_0047c544:
      curl_msnprintf((char *)puVar24,4,"%%%02x");
      lStack_80 = 3;
    }
    puVar24 = puVar24 + lStack_80;
  }
  *puVar24 = '\0';
  if (bVar4 != 0) {
    (*Curl_cfree)(puVar25);
  }
LAB_0047c582:
  if ((((uVar28 & 1) == 0) || (pcVar14 = u->query, pcVar14 == (char *)0x0)) ||
     (sVar11 = strlen(pcVar14), sVar11 == 0)) {
    if ((what == CURLUPART_HOST) && (CVar8 = hostname_check(u,(char *)hostname), CVar8 != CURLUE_OK)
       ) {
      (*Curl_cfree)(hostname);
      return CURLUE_MALFORMED_INPUT;
    }
    pCVar9 = local_38;
    (*Curl_cfree)(local_38->scheme);
    pCVar9->scheme = (char *)hostname;
    if (local_60 != 0) {
      u->portnum = local_60;
      return CURLUE_OK;
    }
    return CURLUE_OK;
  }
  cVar2 = pcVar14[sVar11 - 1];
  sVar13 = strlen((char *)hostname);
  lVar12 = (cVar2 != '&') + sVar11;
  pcVar14 = (char *)(*Curl_cmalloc)(sVar13 + lVar12 + 1);
  if (pcVar14 != (char *)0x0) {
    strcpy(pcVar14,u->query);
    if (cVar2 != '&') {
      pcVar14[sVar11] = '&';
    }
    strcpy(pcVar14 + lVar12,(char *)hostname);
    (*Curl_cfree)(hostname);
    pCVar9 = local_38;
    (*Curl_cfree)(local_38->scheme);
    pCVar9->scheme = pcVar14;
switchD_0047c275_caseD_0:
    return CURLUE_OK;
  }
LAB_0047c6f5:
  (*Curl_cfree)(hostname);
  return CURLUE_OUT_OF_MEMORY;
}

Assistant:

CURLUcode curl_url_set(CURLU *u, CURLUPart what,
                       const char *part, unsigned int flags)
{
  char **storep = NULL;
  long port = 0;
  bool urlencode = (flags & CURLU_URLENCODE)? 1 : 0;
  bool plusencode = FALSE;
  bool urlskipslash = FALSE;
  bool appendquery = FALSE;
  bool equalsencode = FALSE;

  if(!u)
    return CURLUE_BAD_HANDLE;
  if(!part) {
    /* setting a part to NULL clears it */
    switch(what) {
    case CURLUPART_URL:
      break;
    case CURLUPART_SCHEME:
      storep = &u->scheme;
      break;
    case CURLUPART_USER:
      storep = &u->user;
      break;
    case CURLUPART_PASSWORD:
      storep = &u->password;
      break;
    case CURLUPART_OPTIONS:
      storep = &u->options;
      break;
    case CURLUPART_HOST:
      storep = &u->host;
      break;
    case CURLUPART_ZONEID:
      storep = &u->zoneid;
      break;
    case CURLUPART_PORT:
      u->portnum = 0;
      storep = &u->port;
      break;
    case CURLUPART_PATH:
      storep = &u->path;
      break;
    case CURLUPART_QUERY:
      storep = &u->query;
      break;
    case CURLUPART_FRAGMENT:
      storep = &u->fragment;
      break;
    default:
      return CURLUE_UNKNOWN_PART;
    }
    if(storep && *storep) {
      free(*storep);
      *storep = NULL;
    }
    return CURLUE_OK;
  }

  switch(what) {
  case CURLUPART_SCHEME:
    if(strlen(part) > MAX_SCHEME_LEN)
      /* too long */
      return CURLUE_MALFORMED_INPUT;
    if(!(flags & CURLU_NON_SUPPORT_SCHEME) &&
       /* verify that it is a fine scheme */
       !Curl_builtin_scheme(part))
      return CURLUE_UNSUPPORTED_SCHEME;
    storep = &u->scheme;
    urlencode = FALSE; /* never */
    break;
  case CURLUPART_USER:
    storep = &u->user;
    break;
  case CURLUPART_PASSWORD:
    storep = &u->password;
    break;
  case CURLUPART_OPTIONS:
    storep = &u->options;
    break;
  case CURLUPART_HOST:
    storep = &u->host;
    free(u->zoneid);
    u->zoneid = NULL;
    break;
  case CURLUPART_ZONEID:
    storep = &u->zoneid;
    break;
  case CURLUPART_PORT:
  {
    char *endp;
    urlencode = FALSE; /* never */
    port = strtol(part, &endp, 10);  /* Port number must be decimal */
    if((port <= 0) || (port > 0xffff))
      return CURLUE_BAD_PORT_NUMBER;
    if(*endp)
      /* weirdly provided number, not good! */
      return CURLUE_MALFORMED_INPUT;
    storep = &u->port;
  }
  break;
  case CURLUPART_PATH:
    urlskipslash = TRUE;
    storep = &u->path;
    break;
  case CURLUPART_QUERY:
    plusencode = urlencode;
    appendquery = (flags & CURLU_APPENDQUERY)?1:0;
    equalsencode = appendquery;
    storep = &u->query;
    break;
  case CURLUPART_FRAGMENT:
    storep = &u->fragment;
    break;
  case CURLUPART_URL: {
    /*
     * Allow a new URL to replace the existing (if any) contents.
     *
     * If the existing contents is enough for a URL, allow a relative URL to
     * replace it.
     */
    CURLUcode result;
    char *oldurl;
    char *redired_url;
    CURLU *handle2;

    if(Curl_is_absolute_url(part, NULL, MAX_SCHEME_LEN + 1)) {
      handle2 = curl_url();
      if(!handle2)
        return CURLUE_OUT_OF_MEMORY;
      result = parseurl(part, handle2, flags);
      if(!result)
        mv_urlhandle(handle2, u);
      else
        curl_url_cleanup(handle2);
      return result;
    }
    /* extract the full "old" URL to do the redirect on */
    result = curl_url_get(u, CURLUPART_URL, &oldurl, flags);
    if(result) {
      /* couldn't get the old URL, just use the new! */
      handle2 = curl_url();
      if(!handle2)
        return CURLUE_OUT_OF_MEMORY;
      result = parseurl(part, handle2, flags);
      if(!result)
        mv_urlhandle(handle2, u);
      else
        curl_url_cleanup(handle2);
      return result;
    }

    /* apply the relative part to create a new URL */
    redired_url = concat_url(oldurl, part);
    free(oldurl);
    if(!redired_url)
      return CURLUE_OUT_OF_MEMORY;

    /* now parse the new URL */
    handle2 = curl_url();
    if(!handle2) {
      free(redired_url);
      return CURLUE_OUT_OF_MEMORY;
    }
    result = parseurl(redired_url, handle2, flags);
    free(redired_url);
    if(!result)
      mv_urlhandle(handle2, u);
    else
      curl_url_cleanup(handle2);
    return result;
  }
  default:
    return CURLUE_UNKNOWN_PART;
  }
  if(storep) {
    const char *newp = part;
    size_t nalloc = strlen(part);

    if(nalloc > CURL_MAX_INPUT_LENGTH)
      /* excessive input length */
      return CURLUE_MALFORMED_INPUT;

    if(urlencode) {
      const unsigned char *i;
      char *o;
      bool free_part = FALSE;
      char *enc = malloc(nalloc * 3 + 1); /* for worst case! */
      if(!enc)
        return CURLUE_OUT_OF_MEMORY;
      if(plusencode) {
        /* space to plus */
        i = (const unsigned char *)part;
        for(o = enc; *i; ++o, ++i)
          *o = (*i == ' ') ? '+' : *i;
        *o = 0; /* zero terminate */
        part = strdup(enc);
        if(!part) {
          free(enc);
          return CURLUE_OUT_OF_MEMORY;
        }
        free_part = TRUE;
      }
      for(i = (const unsigned char *)part, o = enc; *i; i++) {
        if(Curl_isunreserved(*i) ||
           ((*i == '/') && urlskipslash) ||
           ((*i == '=') && equalsencode) ||
           ((*i == '+') && plusencode)) {
          if((*i == '=') && equalsencode)
            /* only skip the first equals sign */
            equalsencode = FALSE;
          *o = *i;
          o++;
        }
        else {
          msnprintf(o, 4, "%%%02x", *i);
          o += 3;
        }
      }
      *o = 0; /* zero terminate */
      newp = enc;
      if(free_part)
        free((char *)part);
    }
    else {
      char *p;
      newp = strdup(part);
      if(!newp)
        return CURLUE_OUT_OF_MEMORY;
      p = (char *)newp;
      while(*p) {
        /* make sure percent encoded are lower case */
        if((*p == '%') && ISXDIGIT(p[1]) && ISXDIGIT(p[2]) &&
           (ISUPPER(p[1]) || ISUPPER(p[2]))) {
          p[1] = (char)TOLOWER(p[1]);
          p[2] = (char)TOLOWER(p[2]);
          p += 3;
        }
        else
          p++;
      }
    }

    if(appendquery) {
      /* Append the string onto the old query. Add a '&' separator if none is
         present at the end of the exsting query already */
      size_t querylen = u->query ? strlen(u->query) : 0;
      bool addamperand = querylen && (u->query[querylen -1] != '&');
      if(querylen) {
        size_t newplen = strlen(newp);
        char *p = malloc(querylen + addamperand + newplen + 1);
        if(!p) {
          free((char *)newp);
          return CURLUE_OUT_OF_MEMORY;
        }
        strcpy(p, u->query); /* original query */
        if(addamperand)
          p[querylen] = '&'; /* ampersand */
        strcpy(&p[querylen + addamperand], newp); /* new suffix */
        free((char *)newp);
        free(*storep);
        *storep = p;
        return CURLUE_OK;
      }
    }

    if(what == CURLUPART_HOST) {
      if(hostname_check(u, (char *)newp)) {
        free((char *)newp);
        return CURLUE_MALFORMED_INPUT;
      }
    }

    free(*storep);
    *storep = (char *)newp;
  }
  /* set after the string, to make it not assigned if the allocation above
     fails */
  if(port)
    u->portnum = port;
  return CURLUE_OK;
}